

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O0

int mbedtls_entropy_update_seed_file(mbedtls_entropy_context *ctx,char *path)

{
  FILE *__stream;
  size_t sVar1;
  uchar local_438 [8];
  uchar buf [1024];
  size_t local_30;
  size_t n;
  FILE *f;
  char *path_local;
  mbedtls_entropy_context *ctx_local;
  
  __stream = fopen(path,"rb");
  if (__stream == (FILE *)0x0) {
    ctx_local._4_4_ = -0x3f;
  }
  else {
    fseek(__stream,0,2);
    local_30 = ftell(__stream);
    fseek(__stream,0,0);
    if (0x400 < local_30) {
      local_30 = 0x400;
    }
    sVar1 = fread(local_438,1,local_30,__stream);
    if (sVar1 == local_30) {
      fclose(__stream);
      mbedtls_entropy_update_manual(ctx,local_438,local_30);
      ctx_local._4_4_ = mbedtls_entropy_write_seed_file(ctx,path);
    }
    else {
      fclose(__stream);
      ctx_local._4_4_ = -0x3f;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_entropy_update_seed_file( mbedtls_entropy_context *ctx, const char *path )
{
    FILE *f;
    size_t n;
    unsigned char buf[ MBEDTLS_ENTROPY_MAX_SEED_SIZE ];

    if( ( f = fopen( path, "rb" ) ) == NULL )
        return( MBEDTLS_ERR_ENTROPY_FILE_IO_ERROR );

    fseek( f, 0, SEEK_END );
    n = (size_t) ftell( f );
    fseek( f, 0, SEEK_SET );

    if( n > MBEDTLS_ENTROPY_MAX_SEED_SIZE )
        n = MBEDTLS_ENTROPY_MAX_SEED_SIZE;

    if( fread( buf, 1, n, f ) != n )
    {
        fclose( f );
        return( MBEDTLS_ERR_ENTROPY_FILE_IO_ERROR );
    }

    fclose( f );

    mbedtls_entropy_update_manual( ctx, buf, n );

    return( mbedtls_entropy_write_seed_file( ctx, path ) );
}